

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O3

int signo2(int A,int B)

{
  uint uVar1;
  
  uVar1 = A >> 1 ^ A >> 2;
  uVar1 = (int)uVar1 >> 1 ^ uVar1;
  uVar1 = ((int)uVar1 >> 1 ^ uVar1) & B;
  uVar1 = uVar1 - ((uVar1 >> 3 & 0x11111111) + (uVar1 >> 2 & 0x33333333) + (uVar1 >> 1 & 0x77777777)
                  );
  uVar1 = (uVar1 >> 4) + uVar1;
  return uVar1 - (uVar1 & 0xf0f0f0f) / 0xff & 1;
}

Assistant:

int signo2(int A,int B)
{
	//int sig=1;
	//int tA2=((A>>tp)&(B>>tp));
	A>>=1;
	//B&=0xF;
	for(register int i=0;i<3;i++)
		A^=A>>1;
	return bits((A&B))&1;
}